

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_TimingResistantEqual::test_method(util_TimingResistantEqual *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  check_type cVar4;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  lazy_ostream local_d8;
  undefined1 *local_c8;
  char **local_c0;
  allocator<char> local_b2;
  allocator<char> local_b1;
  assertion_result local_b0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1e8;
  file.m_begin = (iterator)&local_88;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_b2);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TimingResistantEqual<std::__cxx11::string>(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "TimingResistantEqual(std::string(\"\"), std::string(\"\"))";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_f8,0x1e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x1e9;
  file_00.m_begin = (iterator)&local_108;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
             msg_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"abc",&local_b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_b2);
  bVar1 = TimingResistantEqual<std::__cxx11::string>(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!TimingResistantEqual(std::string(\"abc\"), std::string(\"\"))";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_120 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_128,0x1e9);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x1ea;
  file_01.m_begin = (iterator)&local_138;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_148,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"abc",&local_b2);
  bVar1 = TimingResistantEqual<std::__cxx11::string>(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!TimingResistantEqual(std::string(\"\"), std::string(\"abc\"))";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_150 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_158,0x1ea);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x1eb;
  file_02.m_begin = (iterator)&local_168;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_178,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"a",&local_b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"aa",&local_b2);
  bVar1 = TimingResistantEqual<std::__cxx11::string>(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!TimingResistantEqual(std::string(\"a\"), std::string(\"aa\"))";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_180 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_188,0x1eb);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x1ec;
  file_03.m_begin = (iterator)&local_198;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a8,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"aa",&local_b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"a",&local_b2);
  bVar1 = TimingResistantEqual<std::__cxx11::string>(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!TimingResistantEqual(std::string(\"aa\"), std::string(\"a\"))";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1b0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_1b8,0x1ec);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x1ed;
  file_04.m_begin = (iterator)&local_1c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d8,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"abc",&local_b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"abc",&local_b2);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TimingResistantEqual<std::__cxx11::string>(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "TimingResistantEqual(std::string(\"abc\"), std::string(\"abc\"))";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1e0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_1e8,0x1ed);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  file_05.m_end = (iterator)0x1ee;
  file_05.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_208,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"abc",&local_b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"aba",&local_b2);
  bVar1 = TimingResistantEqual<std::__cxx11::string>(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!TimingResistantEqual(std::string(\"abc\"), std::string(\"aba\"))";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_210 = "";
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_218,0x1ee);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_TimingResistantEqual)
{
    BOOST_CHECK(TimingResistantEqual(std::string(""), std::string("")));
    BOOST_CHECK(!TimingResistantEqual(std::string("abc"), std::string("")));
    BOOST_CHECK(!TimingResistantEqual(std::string(""), std::string("abc")));
    BOOST_CHECK(!TimingResistantEqual(std::string("a"), std::string("aa")));
    BOOST_CHECK(!TimingResistantEqual(std::string("aa"), std::string("a")));
    BOOST_CHECK(TimingResistantEqual(std::string("abc"), std::string("abc")));
    BOOST_CHECK(!TimingResistantEqual(std::string("abc"), std::string("aba")));
}